

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int ReconstructIntra16(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  uint8_t *puVar2;
  VP8Encoder *enc;
  uint8_t *puVar3;
  int iVar4;
  int16_t (*paiVar5) [16];
  long lVar6;
  int16_t (*paiVar7) [16];
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint local_28c;
  long local_280;
  int16_t dc_tmp [16];
  int16_t tmp [16] [16];
  
  puVar2 = it->yuv_in_;
  enc = it->enc_;
  uVar1 = VP8I16ModeOffsets[mode];
  puVar3 = it->yuv_p_;
  uVar11 = *(byte *)it->mb_ >> 5 & 3;
  paiVar5 = tmp;
  for (uVar8 = 0; uVar8 < 0x10; uVar8 = uVar8 + 2) {
    (*VP8FTransform2)(puVar2 + VP8Scan[uVar8],puVar3 + (ulong)VP8Scan[uVar8] + (ulong)uVar1,*paiVar5
                     );
    paiVar5 = paiVar5 + 2;
  }
  (*VP8FTransformWHT)(tmp[0],dc_tmp);
  iVar4 = (*VP8EncQuantizeBlockWHT)(dc_tmp,rd->y_dc_levels,&enc->dqm_[uVar11].y2_);
  local_28c = iVar4 << 0x18;
  if (it->do_trellis_ == 0) {
    paiVar7 = rd->y_ac_levels;
    paiVar5 = tmp;
    for (uVar8 = 0; uVar8 < 0x10; uVar8 = uVar8 + 2) {
      paiVar5[1][0] = 0;
      (*paiVar5)[0] = 0;
      iVar4 = (*VP8EncQuantize2Blocks)(*paiVar5,*paiVar7,&enc->dqm_[uVar11].y1_);
      local_28c = local_28c | iVar4 << ((byte)uVar8 & 0x1f);
      paiVar7 = paiVar7 + 2;
      paiVar5 = paiVar5 + 2;
    }
  }
  else {
    VP8IteratorNzToBytes(it);
    local_280 = 0;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      lVar10 = (long)(int)local_280;
      paiVar7 = tmp + lVar10;
      paiVar5 = rd->y_ac_levels + lVar10;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        iVar4 = TrellisQuantizeBlock
                          (enc,*paiVar7,*paiVar5,it->left_nz_[lVar9] + it->top_nz_[lVar6],0,
                           &enc->dqm_[uVar11].y1_,enc->dqm_[uVar11].lambda_trellis_i16_);
        it->left_nz_[lVar9] = iVar4;
        it->top_nz_[lVar6] = iVar4;
        (*paiVar5)[0] = 0;
        local_28c = local_28c | iVar4 << ((char)local_280 + (char)lVar6 & 0x1fU);
        paiVar7 = paiVar7 + 1;
        paiVar5 = paiVar5 + 1;
      }
      local_280 = lVar10 + 4;
    }
  }
  paiVar5 = tmp;
  (*VP8TransformWHT)(dc_tmp,*paiVar5);
  for (uVar8 = 0; uVar8 < 0x10; uVar8 = uVar8 + 2) {
    (*VP8ITransform)(puVar3 + (ulong)VP8Scan[uVar8] + (ulong)uVar1,*paiVar5,yuv_out + VP8Scan[uVar8]
                     ,1);
    paiVar5 = paiVar5 + 2;
  }
  return local_28c;
}

Assistant:

static int ReconstructIntra16(VP8EncIterator* const it,
                              VP8ModeScore* const rd,
                              uint8_t* const yuv_out,
                              int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8I16ModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + Y_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[16][16], dc_tmp[16];

  for (n = 0; n < 16; n += 2) {
    VP8FTransform2(src + VP8Scan[n], ref + VP8Scan[n], tmp[n]);
  }
  VP8FTransformWHT(tmp[0], dc_tmp);
  nz |= VP8EncQuantizeBlockWHT(dc_tmp, rd->y_dc_levels, &dqm->y2_) << 24;

  if (DO_TRELLIS_I16 && it->do_trellis_) {
    int x, y;
    VP8IteratorNzToBytes(it);
    for (y = 0, n = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x, ++n) {
        const int ctx = it->top_nz_[x] + it->left_nz_[y];
        const int non_zero = TrellisQuantizeBlock(
            enc, tmp[n], rd->y_ac_levels[n], ctx, TYPE_I16_AC, &dqm->y1_,
            dqm->lambda_trellis_i16_);
        it->top_nz_[x] = it->left_nz_[y] = non_zero;
        rd->y_ac_levels[n][0] = 0;
        nz |= non_zero << n;
      }
    }
  } else {
    for (n = 0; n < 16; n += 2) {
      // Zero-out the first coeff, so that: a) nz is correct below, and
      // b) finding 'last' non-zero coeffs in SetResidualCoeffs() is simplified.
      tmp[n][0] = tmp[n + 1][0] = 0;
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->y_ac_levels[n], &dqm->y1_) << n;
      assert(rd->y_ac_levels[n + 0][0] == 0);
      assert(rd->y_ac_levels[n + 1][0] == 0);
    }
  }

  // Transform back
  VP8TransformWHT(dc_tmp, tmp[0]);
  for (n = 0; n < 16; n += 2) {
    VP8ITransform(ref + VP8Scan[n], tmp[n], yuv_out + VP8Scan[n], 1);
  }

  return nz;
}